

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-listen.c
# Opt level: O0

int rops_handle_POLLIN_listen(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  lws_context *plVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  lws *plVar7;
  uint16_t uStack_da;
  sockaddr_in sain;
  int opts;
  lws *cwsi;
  undefined1 auStack_b8 [4];
  socklen_t clilen;
  sockaddr_storage cli_addr;
  lws_sock_file_fd_type fd;
  lws_sockfd_type accept_fd;
  lws_context *context;
  pollfd *pollfd_local;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  plVar1 = wsi->context;
  cli_addr.__ss_align._4_4_ = -1;
  memset(auStack_b8,0,0x80);
  if (((byte)wsi->vhost->field_0x2b4 >> 2 & 1) == 0) {
    do {
      sain.sin_zero[0] = '\x06';
      sain.sin_zero[1] = '\0';
      sain.sin_zero[2] = '\0';
      sain.sin_zero[3] = '\0';
      if ((pollfd->revents & 5U) == 0) {
        return 5;
      }
      if ((pollfd->events & 1U) == 0) {
        return 5;
      }
      if ((((wsi->vhost->tls).use_ssl != 0) && (plVar1->simultaneous_ssl_restriction != 0)) &&
         (plVar1->simultaneous_ssl == plVar1->simultaneous_ssl_restriction)) {
        return 5;
      }
      cwsi._4_4_ = 0x80;
      cli_addr.__ss_align._4_4_ =
           accept(pollfd->fd,(sockaddr *)auStack_b8,(socklen_t *)((long)&cwsi + 4));
      if (cli_addr.__ss_align._4_4_ == 0xffffffff) {
        piVar5 = __errno_location();
        if (*piVar5 == 0xb) {
          return 5;
        }
        piVar5 = __errno_location();
        if (*piVar5 == 0xb) {
          return 5;
        }
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        _lws_log(1,"accept: %s\n",pcVar6);
        return 5;
      }
      if ((*(ushort *)&plVar1->field_0x510 >> 2 & 1) != 0) {
        close(cli_addr.__ss_align._4_4_);
        return 6;
      }
      lws_plat_set_socket_options(wsi->vhost,cli_addr.__ss_align._4_4_,0);
      uStack_da = SUB82(_auStack_b8,2);
      uVar3 = ntohs(uStack_da);
      _lws_log(0x10,"accepted new conn port %u on fd=%d\n",(ulong)uVar3,
               (ulong)(uint)cli_addr.__ss_align._4_4_);
      iVar4 = (*wsi->vhost->protocols->callback)
                        (wsi,LWS_CALLBACK_FILTER_NETWORK_CONNECTION,(void *)0x0,
                         (void *)(long)cli_addr.__ss_align._4_4_,0);
      if (iVar4 != 0) {
        _lws_log(0x10,"Callback denied net connection\n");
        close(cli_addr.__ss_align._4_4_);
        return 6;
      }
      if ((wsi->vhost->options & 0x400000) == 0) {
        sain.sin_zero[0] = '\a';
        sain.sin_zero[1] = '\0';
        sain.sin_zero[2] = '\0';
        sain.sin_zero[3] = '\0';
      }
      if ((wsi->vhost->tls).use_ssl == 0) {
        sain.sin_zero._0_4_ = sain.sin_zero._0_4_ & 0xfffffffb;
      }
      cli_addr.__ss_align._0_4_ = cli_addr.__ss_align._4_4_;
      plVar7 = lws_adopt_descriptor_vhost
                         (wsi->vhost,sain.sin_zero._0_4_,cli_addr.__ss_align._4_4_,(char *)0x0,
                          (lws *)0x0);
      if (plVar7 == (lws *)0x0) {
        _lws_log(8,"%s: vh %s: adopt failed\n","rops_handle_POLLIN_listen",wsi->vhost->name);
        return 4;
      }
      bVar2 = false;
      if ((pt->fds_count < plVar1->fd_limit_per_thread - 1) &&
         (bVar2 = false, wsi->position_in_fds_table != -1)) {
        iVar4 = lws_poll_listen_fd(pt->fds + wsi->position_in_fds_table);
        bVar2 = 0 < iVar4;
      }
    } while (bVar2);
  }
  return 5;
}

Assistant:

static int
rops_handle_POLLIN_listen(struct lws_context_per_thread *pt, struct lws *wsi,
			  struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->context;
	lws_sockfd_type accept_fd = LWS_SOCK_INVALID;
	lws_sock_file_fd_type fd;
	struct sockaddr_storage cli_addr;
	socklen_t clilen;

	memset(&cli_addr, 0, sizeof(cli_addr));

	/* if our vhost is going down, ignore it */

	if (wsi->vhost->being_destroyed)
		return LWS_HPI_RET_HANDLED;

	/* pollin means a client has connected to us then
	 *
	 * pollout is a hack on esp32 for background accepts signalling
	 * they completed
	 */

	do {
		struct lws *cwsi;
		int opts = LWS_ADOPT_SOCKET | LWS_ADOPT_ALLOW_SSL;

		if (!(pollfd->revents & (LWS_POLLIN | LWS_POLLOUT)) ||
		    !(pollfd->events & LWS_POLLIN))
			break;

#if defined(LWS_WITH_TLS)
		/*
		 * can we really accept it, with regards to SSL limit?
		 * another vhost may also have had POLLIN on his
		 * listener this round and used it up already
		 */
		if (wsi->vhost->tls.use_ssl &&
		    context->simultaneous_ssl_restriction &&
		    context->simultaneous_ssl ==
				  context->simultaneous_ssl_restriction)
			/*
			 * no... ignore it, he won't come again until
			 * we are below the simultaneous_ssl_restriction
			 * limit and POLLIN is enabled on him again
			 */
			break;
#endif
		/* listen socket got an unencrypted connection... */

		clilen = sizeof(cli_addr);

		/*
		 * We cannot identify the peer who is in the listen
		 * socket connect queue before we accept it; even if
		 * we could, not accepting it due to PEER_LIMITS would
		 * block the connect queue for other legit peers.
		 */

		accept_fd = accept((int)pollfd->fd,
				   (struct sockaddr *)&cli_addr, &clilen);
		if (accept_fd == LWS_SOCK_INVALID) {
			if (LWS_ERRNO == LWS_EAGAIN ||
			    LWS_ERRNO == LWS_EWOULDBLOCK) {
				break;
			}
			lwsl_err("accept: %s\n", strerror(LWS_ERRNO));
			return LWS_HPI_RET_HANDLED;
		}

		if (context->being_destroyed) {
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		lws_plat_set_socket_options(wsi->vhost, accept_fd, 0);

#if defined(LWS_WITH_IPV6)
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			((cli_addr.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &cli_addr)->sin6_port) :
			ntohs(((struct sockaddr_in *) &cli_addr)->sin_port)),
			accept_fd);
#else
		{
		struct sockaddr_in sain;

		memcpy(&sain, &cli_addr, sizeof(sain));
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			   ntohs(sain.sin_port),
			   accept_fd);
		}
#endif

		/*
		 * look at who we connected to and give user code a
		 * chance to reject based on client IP.  There's no
		 * protocol selected yet so we issue this to
		 * protocols[0]
		 */
		if ((wsi->vhost->protocols[0].callback)(wsi,
				LWS_CALLBACK_FILTER_NETWORK_CONNECTION,
				NULL,
				(void *)(lws_intptr_t)accept_fd, 0)) {
			lwsl_debug("Callback denied net connection\n");
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		if (!(wsi->vhost->options &
			LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG))
			opts |= LWS_ADOPT_HTTP;

#if defined(LWS_WITH_TLS)
		if (!wsi->vhost->tls.use_ssl)
#endif
			opts &= ~LWS_ADOPT_ALLOW_SSL;

		fd.sockfd = accept_fd;
		cwsi = lws_adopt_descriptor_vhost(wsi->vhost, opts, fd,
						  NULL, NULL);
		if (!cwsi) {
			lwsl_info("%s: vh %s: adopt failed\n", __func__,
					wsi->vhost->name);

			/* already closed cleanly as necessary */
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}
/*
		if (lws_server_socket_service_ssl(cwsi, accept_fd)) {
			lws_close_free_wsi(cwsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "listen svc fail");
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}

		lwsl_info("%s: new wsi %p: wsistate 0x%lx, role_ops %s\n",
			    __func__, cwsi, (unsigned long)cwsi->wsistate,
			    cwsi->role_ops->name);
*/

	} while (pt->fds_count < context->fd_limit_per_thread - 1 &&
		 wsi->position_in_fds_table != LWS_NO_FDS_POS &&
		 lws_poll_listen_fd(&pt->fds[wsi->position_in_fds_table]) > 0);

	return LWS_HPI_RET_HANDLED;
}